

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O0

QString * __thiscall QTextHtmlExporter::toHtml(QTextHtmlExporter *this,ExportMode mode)

{
  bool bVar1;
  int iVar2;
  SpacingType SVar3;
  int in_EDX;
  QTextFormat *in_RSI;
  QTextFormat *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  qreal qVar5;
  QLatin1StringView QVar6;
  QStringBuilder<QString_&,_char16_t> QVar7;
  bool atLeastOneDecorationSet;
  qreal value;
  bool percentSpacing;
  QString decorationTag;
  QString title;
  QTextFrameFormat defaultFmt;
  QTextFrameFormat rootFmt;
  QTextFrameFormat fmt;
  QTextFormat *this_00;
  QLatin1StringView in_stack_fffffffffffffcb0;
  Iterator *frameIt;
  QTextHtmlExporter *this_01;
  QLatin1StringView in_stack_fffffffffffffcc0;
  QTextFormat *format;
  QLatin1StringView in_stack_fffffffffffffcd0;
  QLatin1StringView in_stack_fffffffffffffce0;
  bool local_309;
  double local_2c8;
  QLatin1String *local_188;
  QChar local_15c;
  QChar local_15a;
  QString *local_158;
  char16_t local_150;
  undefined2 local_142;
  undefined1 *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  undefined1 local_128 [24];
  undefined1 local_110 [28];
  QChar local_f4;
  QChar local_f2;
  undefined1 local_f0 [24];
  undefined1 local_d8 [24];
  undefined1 local_c0 [48];
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_28;
  undefined1 *local_20;
  QString *local_18;
  char16_t local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QVar6 = Qt::Literals::StringLiterals::operator____L1((char *)in_RSI,(size_t)in_RDI);
  local_188 = (QLatin1String *)QVar6.m_size;
  QString::operator=((QString *)in_RSI,local_188);
  QTextDocumentPrivate::get((QTextDocument *)0x7b0485);
  QTextDocumentPrivate::length((QTextDocumentPrivate *)0x7b048d);
  QString::reserve((QString *)in_stack_fffffffffffffcb0.m_size,
                   (qsizetype)in_stack_fffffffffffffcc0.m_data);
  *(bool *)&((DataPointer *)&in_RSI[3].d)->d = in_EDX == 1;
  Qt::Literals::StringLiterals::operator____L1((char *)in_RSI,(size_t)this_00);
  QString::operator+=((QString *)in_RDI,in_stack_fffffffffffffcb0);
  local_90 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  local_80 = &DAT_aaaaaaaaaaaaaaaa;
  QTextDocument::metaInformation
            ((QTextDocument *)in_stack_fffffffffffffcb0.m_data,
             in_stack_fffffffffffffcb0.m_size._4_4_);
  bVar1 = QString::isEmpty((QString *)0x7b053d);
  if (!bVar1) {
    Qt::Literals::StringLiterals::operator____L1((char *)in_RSI,(size_t)this_00);
    QString::operator+=((QString *)in_RDI,in_stack_fffffffffffffcb0);
    QString::operator+=((QString *)this_00,(QString *)in_RDI);
    Qt::Literals::StringLiterals::operator____L1((char *)in_RSI,(size_t)this_00);
    QString::operator+=((QString *)in_RDI,in_stack_fffffffffffffcb0);
  }
  Qt::Literals::StringLiterals::operator____L1((char *)in_RSI,(size_t)this_00);
  QString::operator+=((QString *)in_RDI,in_stack_fffffffffffffcb0);
  Qt::Literals::StringLiterals::operator____L1((char *)in_RSI,(size_t)this_00);
  QString::operator+=((QString *)in_RDI,in_stack_fffffffffffffcb0);
  Qt::Literals::StringLiterals::operator____L1((char *)in_RSI,(size_t)this_00);
  QString::operator+=((QString *)in_RDI,in_stack_fffffffffffffcb0);
  Qt::Literals::StringLiterals::operator____L1((char *)in_RSI,(size_t)this_00);
  QString::operator+=((QString *)in_RDI,in_stack_fffffffffffffcb0);
  Qt::Literals::StringLiterals::operator____L1((char *)in_RSI,(size_t)this_00);
  QString::operator+=((QString *)in_RDI,in_stack_fffffffffffffcb0);
  Qt::Literals::StringLiterals::operator____L1((char *)in_RSI,(size_t)this_00);
  QString::operator+=((QString *)in_RDI,in_stack_fffffffffffffcb0);
  Qt::Literals::StringLiterals::operator____L1((char *)in_RSI,(size_t)this_00);
  QString::operator+=((QString *)in_RDI,in_stack_fffffffffffffcb0);
  format = (QTextFormat *)in_stack_fffffffffffffcd0.m_size;
  if (in_EDX != 0) {
    QTextCharFormat::QTextCharFormat((QTextCharFormat *)0x7b1034);
    QTextCharFormat::operator=((QTextCharFormat *)this_00,(QTextCharFormat *)in_RDI);
    QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x7b1057);
    goto LAB_007b1057;
  }
  Qt::Literals::StringLiterals::operator____L1((char *)in_RSI,(size_t)this_00);
  QString::operator+=((QString *)in_RDI,in_stack_fffffffffffffcb0);
  resolvedFontFamilies((QTextCharFormat *)in_stack_fffffffffffffcb0.m_size);
  emitFontFamily((QTextHtmlExporter *)in_stack_fffffffffffffce0.m_data,
                 (QStringList *)in_stack_fffffffffffffce0.m_size);
  QList<QString>::~QList((QList<QString> *)0x7b07e8);
  bVar1 = QTextFormat::hasProperty
                    ((QTextFormat *)in_stack_fffffffffffffcb0.m_size,(int)((ulong)in_RSI >> 0x20));
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____L1((char *)in_RSI,(size_t)this_00);
    QString::operator+=((QString *)in_RDI,in_stack_fffffffffffffcb0);
    qVar5 = QTextCharFormat::fontPointSize((QTextCharFormat *)0x7b084d);
    QString::number(qVar5,(char)local_c0,0x67);
    QString::operator+=((QString *)this_00,(QString *)in_RDI);
    QString::~QString((QString *)0x7b0883);
    Qt::Literals::StringLiterals::operator____L1((char *)in_RSI,(size_t)this_00);
    QString::operator+=((QString *)in_RDI,in_stack_fffffffffffffcb0);
  }
  else {
    bVar1 = QTextFormat::hasProperty
                      ((QTextFormat *)in_stack_fffffffffffffcb0.m_size,(int)((ulong)in_RSI >> 0x20))
    ;
    if (bVar1) {
      Qt::Literals::StringLiterals::operator____L1((char *)in_RSI,(size_t)this_00);
      QString::operator+=((QString *)in_RDI,in_stack_fffffffffffffcb0);
      iVar2 = QTextFormat::intProperty
                        ((QTextFormat *)in_stack_fffffffffffffcb0.m_size,
                         (int)((ulong)in_RSI >> 0x20));
      QString::number((int)local_d8,iVar2);
      QString::operator+=((QString *)this_00,(QString *)in_RDI);
      QString::~QString((QString *)0x7b0960);
      Qt::Literals::StringLiterals::operator____L1((char *)in_RSI,(size_t)this_00);
      QString::operator+=((QString *)in_RDI,in_stack_fffffffffffffcb0);
    }
  }
  Qt::Literals::StringLiterals::operator____L1((char *)in_RSI,(size_t)this_00);
  QString::operator+=((QString *)in_RDI,in_stack_fffffffffffffcb0);
  iVar2 = QTextCharFormat::fontWeight((QTextCharFormat *)this_00);
  QString::number((int)local_f0,iVar2);
  QString::operator+=((QString *)this_00,(QString *)in_RDI);
  QString::~QString((QString *)0x7b0a19);
  QChar::QChar<char16_t,_true>(&local_f2,L';');
  QString::operator+=((QString *)this_00,(QChar)(char16_t)((ulong)in_RSI >> 0x30));
  Qt::Literals::StringLiterals::operator____L1((char *)in_RSI,(size_t)this_00);
  QString::operator+=((QString *)in_RDI,in_stack_fffffffffffffcb0);
  bVar1 = QTextCharFormat::fontItalic((QTextCharFormat *)0x7b0a86);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____L1((char *)in_RSI,(size_t)this_00);
  }
  else {
    Qt::Literals::StringLiterals::operator____L1((char *)in_RSI,(size_t)this_00);
  }
  QString::operator+=((QString *)in_RDI,in_stack_fffffffffffffcb0);
  QChar::QChar<char16_t,_true>(&local_f4,L';');
  QString::operator+=((QString *)this_00,(QChar)(char16_t)((ulong)in_RSI >> 0x30));
  SVar3 = QTextCharFormat::fontLetterSpacingType((QTextCharFormat *)0x7b0b1c);
  bVar4 = SVar3 == PercentageSpacing;
  bVar1 = QTextFormat::hasProperty
                    ((QTextFormat *)in_stack_fffffffffffffcb0.m_size,(int)((ulong)in_RSI >> 0x20));
  if (bVar1) {
    if (bVar4) {
      qVar5 = QTextCharFormat::fontLetterSpacing((QTextCharFormat *)0x7b0b5f);
      if ((qVar5 == 0.0) && (!NAN(qVar5))) goto LAB_007b0c9c;
    }
    Qt::Literals::StringLiterals::operator____L1((char *)in_RSI,(size_t)this_00);
    QString::operator+=((QString *)in_RDI,in_stack_fffffffffffffcb0);
    local_2c8 = QTextCharFormat::fontLetterSpacing((QTextCharFormat *)0x7b0bb8);
    if (bVar4) {
      local_2c8 = local_2c8 / 100.0 - 1.0;
    }
    QString::number(local_2c8,(char)local_110,0x67);
    QString::operator+=((QString *)this_00,(QString *)in_RDI);
    QString::~QString((QString *)0x7b0c34);
    if (bVar4) {
      Qt::Literals::StringLiterals::operator____L1((char *)in_RSI,(size_t)this_00);
    }
    else {
      Qt::Literals::StringLiterals::operator____L1((char *)in_RSI,(size_t)this_00);
    }
    QString::operator+=((QString *)in_RDI,in_stack_fffffffffffffcb0);
  }
LAB_007b0c9c:
  bVar1 = QTextFormat::hasProperty
                    ((QTextFormat *)in_stack_fffffffffffffcb0.m_size,(int)((ulong)in_RSI >> 0x20));
  if (bVar1) {
    qVar5 = QTextCharFormat::fontWordSpacing((QTextCharFormat *)0x7b0cc6);
    if ((qVar5 != 0.0) || (NAN(qVar5))) {
      Qt::Literals::StringLiterals::operator____L1((char *)in_RSI,(size_t)this_00);
      QString::operator+=((QString *)in_RDI,in_stack_fffffffffffffcb0);
      qVar5 = QTextCharFormat::fontWordSpacing((QTextCharFormat *)0x7b0d1f);
      QString::number(qVar5,(char)local_128,0x67);
      QString::operator+=((QString *)this_00,(QString *)in_RDI);
      QString::~QString((QString *)0x7b0d55);
      Qt::Literals::StringLiterals::operator____L1((char *)in_RSI,(size_t)this_00);
      QString::operator+=((QString *)in_RDI,in_stack_fffffffffffffcb0);
    }
  }
  local_140 = &DAT_aaaaaaaaaaaaaaaa;
  local_138 = &DAT_aaaaaaaaaaaaaaaa;
  local_130 = &DAT_aaaaaaaaaaaaaaaa;
  Qt::Literals::StringLiterals::operator____L1((char *)in_RSI,(size_t)this_00);
  QString::QString((QString *)in_stack_fffffffffffffcb0.m_size,in_stack_fffffffffffffcd0);
  local_309 = false;
  bVar1 = QTextFormat::hasProperty
                    ((QTextFormat *)in_stack_fffffffffffffcb0.m_size,(int)((ulong)in_RSI >> 0x20));
  if (((bVar1) ||
      (bVar1 = QTextFormat::hasProperty
                         ((QTextFormat *)in_stack_fffffffffffffcb0.m_size,
                          (int)((ulong)in_RSI >> 0x20)), bVar1)) &&
     (local_309 = QTextCharFormat::fontUnderline((QTextCharFormat *)in_RDI), local_309)) {
    in_stack_fffffffffffffce0 =
         Qt::Literals::StringLiterals::operator____L1((char *)in_RSI,(size_t)this_00);
    QString::operator+=((QString *)in_RDI,in_stack_fffffffffffffcb0);
  }
  bVar1 = QTextFormat::hasProperty
                    ((QTextFormat *)in_stack_fffffffffffffcb0.m_size,(int)((ulong)in_RSI >> 0x20));
  if ((bVar1) && (bVar1 = QTextCharFormat::fontOverline((QTextCharFormat *)0x7b0e8c), bVar1)) {
    in_stack_fffffffffffffcd0 =
         Qt::Literals::StringLiterals::operator____L1((char *)in_RSI,(size_t)this_00);
    QString::operator+=((QString *)in_RDI,in_stack_fffffffffffffcb0);
    local_309 = true;
  }
  bVar1 = QTextFormat::hasProperty
                    ((QTextFormat *)in_stack_fffffffffffffcb0.m_size,(int)((ulong)in_RSI >> 0x20));
  if ((bVar1) && (bVar1 = QTextCharFormat::fontStrikeOut((QTextCharFormat *)0x7b0ef2), bVar1)) {
    in_stack_fffffffffffffcc0 =
         Qt::Literals::StringLiterals::operator____L1((char *)in_RSI,(size_t)this_00);
    QString::operator+=((QString *)in_RDI,in_stack_fffffffffffffcb0);
    local_309 = true;
  }
  if (local_309 != false) {
    local_142 = 0x3b;
    QVar7 = ::operator+((QString *)in_RSI,(char16_t *)this_00);
    local_158 = QVar7.a;
    local_150 = QVar7.b;
    local_18 = local_158;
    local_10 = local_150;
    ::operator+=((QString *)in_stack_fffffffffffffcd0.m_size,
                 (QStringBuilder<QString_&,_char16_t> *)in_stack_fffffffffffffcc0.m_data);
  }
  QChar::QChar<char16_t,_true>(&local_15a,L'\"');
  QString::operator+=((QString *)this_00,(QChar)(char16_t)((ulong)in_RSI >> 0x30));
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  QTextDocument::rootFrame((QTextDocument *)this_00);
  QTextFrame::frameFormat((QTextFrame *)in_stack_fffffffffffffcb0.m_size);
  format = (QTextFormat *)in_stack_fffffffffffffcd0.m_size;
  emitBackgroundAttribute((QTextHtmlExporter *)in_stack_fffffffffffffcd0.m_data,format);
  QTextFrameFormat::~QTextFrameFormat((QTextFrameFormat *)0x7b1018);
  QString::~QString((QString *)0x7b1025);
LAB_007b1057:
  QChar::QChar<char16_t,_true>(&local_15c,L'>');
  QString::operator+=((QString *)this_00,(QChar)(char16_t)((ulong)in_RSI >> 0x30));
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QTextDocument::rootFrame((QTextDocument *)this_00);
  frameIt = (Iterator *)in_stack_fffffffffffffcb0.m_data;
  QTextFrame::frameFormat((QTextFrame *)in_stack_fffffffffffffcb0.m_size);
  QTextFormat::clearProperty(this_00,(int)((ulong)in_RDI >> 0x20));
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QTextFrameFormat::QTextFrameFormat((QTextFrameFormat *)this_00);
  QTextDocument::documentMargin((QTextDocument *)this_00);
  this_01 = (QTextHtmlExporter *)in_stack_fffffffffffffcc0.m_size;
  QTextFrameFormat::setMargin((QTextFrameFormat *)in_stack_fffffffffffffcc0.m_data,(qreal)this_01);
  bVar1 = QTextFormat::operator==(in_RSI,this_00);
  if (bVar1) {
    QTextDocument::rootFrame((QTextDocument *)this_00);
    QTextFrame::begin((QTextFrame *)format);
    emitFrame(this_01,frameIt);
  }
  else {
    QTextDocument::rootFrame((QTextDocument *)this_00);
    emitTextFrame((QTextHtmlExporter *)in_stack_fffffffffffffce0.m_data,
                  (QTextFrame *)in_stack_fffffffffffffce0.m_size);
  }
  QVar6 = Qt::Literals::StringLiterals::operator____L1((char *)in_RSI,(size_t)this_00);
  QString::operator+=((QString *)in_RDI,QVar6);
  QString::QString((QString *)this_00,(QString *)in_RDI);
  QTextFrameFormat::~QTextFrameFormat((QTextFrameFormat *)0x7b11c1);
  QTextFrameFormat::~QTextFrameFormat((QTextFrameFormat *)0x7b11ce);
  QString::~QString((QString *)0x7b11db);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QString *)this_00;
}

Assistant:

QString QTextHtmlExporter::toHtml(ExportMode mode)
{
    html = "<!DOCTYPE HTML PUBLIC \"-//W3C//DTD HTML 4.0//EN\" "
           "\"http://www.w3.org/TR/REC-html40/strict.dtd\">\n"
           "<html><head><meta name=\"qrichtext\" content=\"1\" />"_L1;
    html.reserve(QTextDocumentPrivate::get(doc)->length());

    fragmentMarkers = (mode == ExportFragment);

    html += "<meta charset=\"utf-8\" />"_L1;

    QString title  = doc->metaInformation(QTextDocument::DocumentTitle);
    if (!title.isEmpty()) {
        html += "<title>"_L1;
        html += title;
        html += "</title>"_L1;
    }
    html += "<style type=\"text/css\">\n"_L1;
    html += "p, li { white-space: pre-wrap; }\n"_L1;
    html += "hr { height: 1px; border-width: 0; }\n"_L1;
    html += "li.unchecked::marker { content: \"\\2610\"; }\n"_L1;
    html += "li.checked::marker { content: \"\\2612\"; }\n"_L1;
    html += "</style>"_L1;
    html += "</head><body"_L1;

    if (mode == ExportEntireDocument) {
        html += " style=\""_L1;

        emitFontFamily(resolvedFontFamilies(defaultCharFormat));

        if (defaultCharFormat.hasProperty(QTextFormat::FontPointSize)) {
            html += " font-size:"_L1;
            html += QString::number(defaultCharFormat.fontPointSize());
            html += "pt;"_L1;
        } else if (defaultCharFormat.hasProperty(QTextFormat::FontPixelSize)) {
            html += " font-size:"_L1;
            html += QString::number(defaultCharFormat.intProperty(QTextFormat::FontPixelSize));
            html += "px;"_L1;
        }

        html += " font-weight:"_L1;
        html += QString::number(defaultCharFormat.fontWeight());
        html += u';';

        html += " font-style:"_L1;
        html += (defaultCharFormat.fontItalic() ? "italic"_L1 : "normal"_L1);
        html += u';';

        const bool percentSpacing = (defaultCharFormat.fontLetterSpacingType() == QFont::PercentageSpacing);
        if (defaultCharFormat.hasProperty(QTextFormat::FontLetterSpacing) &&
            (!percentSpacing || defaultCharFormat.fontLetterSpacing() != 0.0)) {
            html += " letter-spacing:"_L1;
            qreal value = defaultCharFormat.fontLetterSpacing();
            if (percentSpacing) // Map to em (100% == 0em)
                value = (value / 100) - 1;
            html += QString::number(value);
            html += percentSpacing ? "em;"_L1 : "px;"_L1;
        }

        if (defaultCharFormat.hasProperty(QTextFormat::FontWordSpacing) &&
            defaultCharFormat.fontWordSpacing() != 0.0) {
            html += " word-spacing:"_L1;
            html += QString::number(defaultCharFormat.fontWordSpacing());
            html += "px;"_L1;
        }

        QString decorationTag(" text-decoration:"_L1);
        bool atLeastOneDecorationSet = false;
        if (defaultCharFormat.hasProperty(QTextFormat::FontUnderline) || defaultCharFormat.hasProperty(QTextFormat::TextUnderlineStyle)) {
            if (defaultCharFormat.fontUnderline()) {
                decorationTag += " underline"_L1;
                atLeastOneDecorationSet = true;
            }
        }
        if (defaultCharFormat.hasProperty(QTextFormat::FontOverline)) {
            if (defaultCharFormat.fontOverline()) {
                decorationTag += " overline"_L1;
                atLeastOneDecorationSet = true;
            }
        }
        if (defaultCharFormat.hasProperty(QTextFormat::FontStrikeOut)) {
            if (defaultCharFormat.fontStrikeOut()) {
                decorationTag += " line-through"_L1;
                atLeastOneDecorationSet = true;
            }
        }
        if (atLeastOneDecorationSet)
            html += decorationTag + u';';

        html += u'\"';

        const QTextFrameFormat fmt = doc->rootFrame()->frameFormat();
        emitBackgroundAttribute(fmt);

    } else {
        defaultCharFormat = QTextCharFormat();
    }
    html += u'>';

    QTextFrameFormat rootFmt = doc->rootFrame()->frameFormat();
    rootFmt.clearProperty(QTextFormat::BackgroundBrush);

    QTextFrameFormat defaultFmt;
    defaultFmt.setMargin(doc->documentMargin());

    if (rootFmt == defaultFmt)
        emitFrame(doc->rootFrame()->begin());
    else
        emitTextFrame(doc->rootFrame());

    html += "</body></html>"_L1;
    return html;
}